

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_> __thiscall
wabt::MakeUnique<wabt::ExceptionImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  ExceptionImport *this_00;
  
  this_00 = (ExceptionImport *)operator_new(0x88);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  ExceptionImport::ExceptionImport(this_00,name);
  *(ExceptionImport **)this = this_00;
  return (__uniq_ptr_data<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>,_true,_true>
          )(__uniq_ptr_data<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}